

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_scheduler.c
# Opt level: O2

int sched_thread_cleanup(mk_sched_worker *sched,mk_list *list)

{
  mk_sched_worker *pmVar1;
  int iVar2;
  mk_sched_worker *pmVar3;
  
  iVar2 = 0;
  pmVar3 = (mk_sched_worker *)sched->accepted_connections;
  while (pmVar3 != sched) {
    pmVar1 = (mk_sched_worker *)pmVar3->accepted_connections;
    mk_http_thread_destroy((mk_http_thread *)&pmVar3[-1].threads);
    iVar2 = iVar2 + 1;
    pmVar3 = pmVar1;
  }
  return iVar2;
}

Assistant:

static int sched_thread_cleanup(struct mk_sched_worker *sched,
                                struct mk_list *list)
{
    int c = 0;
    struct mk_list *tmp;
    struct mk_list *head;
    struct mk_http_thread *mth;
    (void) sched;

    mk_list_foreach_safe(head, tmp, list) {
        mth = mk_list_entry(head, struct mk_http_thread, _head);
        mk_http_thread_destroy(mth);
        c++;
    }

    return c;

}